

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O3

void __thiscall
re2c::Node::cover<unsigned_int,unsigned_int>
          (Node *this,path_t *prefix,FILE *input,FILE *keys,covers_t *size)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  uint uVar3;
  rule_t rVar4;
  pointer ppvVar5;
  pointer ppvVar6;
  pointer puVar7;
  pointer puVar8;
  bool bVar9;
  byte bVar10;
  path_t *ppVar11;
  void *pvVar12;
  _Rb_tree_node_base *p_Var13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong count;
  ulong uVar17;
  ulong len;
  size_t buffer_size;
  uint m;
  path_t local_68;
  
  bVar9 = end(this);
  ppVar11 = this->suffix;
  if (bVar9) {
    if (ppVar11 == (path_t *)0x0) {
      ppVar11 = (path_t *)operator_new(0x38);
      rVar4 = this->rule;
      bVar9 = this->ctx;
      (ppVar11->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (ppVar11->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (ppVar11->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ppVar11->rule = rVar4;
      ppVar11->rule_pos = 0;
      ppVar11->ctx = bVar9;
      ppVar11->ctx_pos = 0;
      this->suffix = ppVar11;
    }
  }
  else if (ppVar11 == (path_t *)0x0) {
    bVar10 = this->loop;
    if (1 < bVar10) {
      return;
    }
    this->loop = bVar10 + 1;
    p_Var13 = (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->arcs)._M_t._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)p_Var13 != p_Var1) && (size->value != 0x40000000)) {
      do {
        std::
        vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ::vector(&local_68.arcs,&prefix->arcs);
        local_68.rule = prefix->rule;
        local_68.rule_pos = prefix->rule_pos;
        local_68.ctx = prefix->ctx;
        local_68._41_7_ = *(undefined7 *)&prefix->field_0x29;
        local_68.ctx_pos = prefix->ctx_pos;
        path_t::extend(&local_68,*(rule_t *)(*(long *)(p_Var13 + 1) + 100),
                       *(bool *)(*(long *)(p_Var13 + 1) + 0x6c),(arc_t *)&p_Var13[1]._M_parent);
        cover<unsigned_int,unsigned_int>(*(Node **)(p_Var13 + 1),&local_68,input,keys,size);
        if ((*(long *)(*(long *)(p_Var13 + 1) + 0xa8) != 0) && (this->suffix == (path_t *)0x0)) {
          ppVar11 = (path_t *)operator_new(0x38);
          rVar4 = this->rule;
          bVar9 = this->ctx;
          (ppVar11->arcs).
          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (ppVar11->arcs).
          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (ppVar11->arcs).
          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ppVar11->rule = rVar4;
          ppVar11->rule_pos = 0;
          ppVar11->ctx = bVar9;
          ppVar11->ctx_pos = 0;
          this->suffix = ppVar11;
          path_t::extend(ppVar11,*(rule_t *)(*(long *)(p_Var13 + 1) + 100),
                         *(bool *)(*(long *)(p_Var13 + 1) + 0x6c),(arc_t *)&p_Var13[1]._M_parent);
          path_t::append(this->suffix,*(path_t **)(*(long *)(p_Var13 + 1) + 0xa8));
        }
        pvVar12 = (void *)CONCAT44(local_68.arcs.
                                   super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_68.arcs.
                                   super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_4_);
        if (pvVar12 != (void *)0x0) {
          operator_delete(pvVar12,(long)local_68.arcs.
                                        super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pvVar12);
        }
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while (((_Rb_tree_header *)p_Var13 != p_Var1) && (size->value != 0x40000000));
      bVar10 = this->loop - 1;
    }
    this->loop = bVar10;
    return;
  }
  path_t::append(prefix,ppVar11);
  ppvVar5 = (prefix->arcs).
            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppvVar6 = (prefix->arcs).
            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  len = (long)ppvVar6 - (long)ppvVar5 >> 3;
  uVar2 = size->value;
  if (ppvVar6 == ppvVar5) {
    count = 0;
  }
  else {
    lVar14 = 0;
    count = 0;
    do {
      uVar17 = (long)(ppvVar5[lVar14]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(ppvVar5[lVar14]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (uVar17 < count) {
        uVar17 = count;
      }
      count = uVar17;
      lVar14 = lVar14 + 1;
    } while (len + (len == 0) != lVar14);
  }
  uVar17 = 0x40000000;
  if (len < 0x40000000) {
    uVar17 = len;
  }
  uVar15 = 0x40000000;
  if (count < 0x40000000) {
    uVar15 = count;
  }
  uVar15 = uVar15 * uVar17;
  uVar17 = 0x40000000;
  if (uVar15 < 0x40000000) {
    pvVar12 = operator_new__(uVar15 * 4);
    if (ppvVar6 != ppvVar5) {
      lVar14 = 0;
      do {
        if (count != 0) {
          puVar7 = (ppvVar5[lVar14]->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar8 = (ppvVar5[lVar14]->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          uVar17 = 0;
          do {
            uVar3 = puVar7[uVar17 % (ulong)((long)puVar8 - (long)puVar7 >> 2)];
            lVar16 = 0;
            ppVar11 = &local_68;
            do {
              *(char *)&(ppVar11->arcs).
                        super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                   (char)(uVar3 >> ((byte)lVar16 & 0x1f));
              lVar16 = lVar16 + 8;
              ppVar11 = (path_t *)
                        ((long)&(ppVar11->arcs).
                                super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
            } while (lVar16 != 0x20);
            *(undefined4 *)((long)pvVar12 + uVar17 * len * 4 + lVar14 * 4) =
                 local_68.arcs.
                 super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_;
            uVar17 = uVar17 + 1;
          } while (uVar17 != count);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != len + (len == 0));
    }
    fwrite(pvVar12,4,uVar15,(FILE *)input);
    operator_delete__(pvVar12);
    keygen<unsigned_int>
              (keys,count,len,(&prefix->rule_pos)[(ulong)(prefix->rule).restorectx * 2],
               (rule_rank_t)(prefix->rule).rank.value);
    uVar17 = uVar15;
  }
  uVar17 = uVar17 + uVar2;
  if (0x3fffffff < uVar17) {
    uVar17 = 0x40000000;
  }
  size->value = (uint32_t)uVar17;
  return;
}

Assistant:

void Node::cover (path_t & prefix, FILE * input, FILE * keys, covers_t &size)
{
	if (end () && suffix == NULL)
	{
		suffix = new path_t (rule, ctx);
	}
	if (suffix != NULL)
	{
		prefix.append (suffix);
		size = size + cover_one<cunit_t, key_t> (input, keys, prefix);
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcs_t::iterator i = arcs.begin ();
			i != arcs.end () && !size.overflow(); ++i)
		{
			path_t new_prefix = prefix;
			new_prefix.extend (i->first->rule, i->first->ctx, &i->second);
			i->first->cover<cunit_t, key_t> (new_prefix, input, keys, size);
			if (i->first->suffix != NULL && suffix == NULL)
			{
				suffix = new path_t (rule, ctx);
				suffix->extend (i->first->rule, i->first->ctx, &i->second);
				suffix->append (i->first->suffix);
			}
		}
	}
}